

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniqueid_linux.c
# Opt level: O0

int UNIQUEID_RESULT_FromString(char *enumAsString,UNIQUEID_RESULT *destination)

{
  int iVar1;
  ulong local_28;
  size_t i;
  UNIQUEID_RESULT *destination_local;
  char *enumAsString_local;
  
  if ((enumAsString != (char *)0x0) && (destination != (UNIQUEID_RESULT *)0x0)) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar1 = strcmp(enumAsString,UNIQUEID_RESULTStringStorage[local_28]);
      if (iVar1 == 0) {
        *destination = (UNIQUEID_RESULT)local_28;
        return 0;
      }
    }
  }
  return 0xd;
}

Assistant:

UNIQUEID_RESULT UniqueId_Generate(char* uid, size_t len)
{
    UNIQUEID_RESULT result;

    /* Codes_SRS_UNIQUEID_07_002: [If uid is NULL then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    /* Codes_SRS_UNIQUEID_07_003: [If len is less then 37 then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    if (uid == NULL || len < 37)
    {
        result = UNIQUEID_INVALID_ARG;
        LogError("Buffer Size is Null. (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(UNIQUEID_RESULT, result));
    }
    else
    {
        uuid_t uuidVal;
        uuid_generate(uuidVal);

        /* Codes_SRS_UNIQUEID_07_001: [UniqueId_Generate shall create a unique Id 36 character long string.] */
        memset(uid, 0, len);
        uuid_unparse(uuidVal, uid);
        result = UNIQUEID_OK;
    }
    return result;
}